

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O3

void Cnf_CutDeref(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  
  if ('\0' < pCut->nFanins) {
    lVar5 = 0;
    do {
      pVVar2 = p->pManAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        return;
      }
      uVar1 = *(uint *)((long)pCut[1].vIsop + lVar5 * 4 + -8);
      if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar2->pArray[uVar1];
      if (pvVar3 == (void *)0x0) {
        return;
      }
      uVar4 = *(ulong *)((long)pvVar3 + 0x18);
      if ((uVar4 & 0xffffffc0) == 0) {
        __assert_fail("pObj->nRefs > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfCut.c"
                      ,0x8d,"void Cnf_CutDeref(Cnf_Man_t *, Cnf_Cut_t *)");
      }
      *(ulong *)((long)pvVar3 + 0x18) =
           uVar4 & 0xffffffff0000003f | (ulong)((int)uVar4 - 0x40U & 0xffffffc0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pCut->nFanins);
  }
  return;
}

Assistant:

void Cnf_CutDeref( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        assert( pObj->nRefs > 0 );
        pObj->nRefs--;
    }
}